

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# r_draw_pal.cpp
# Opt level: O1

void __thiscall
swrenderer::DrawWallRevSubClamp4PalCommand::Execute
          (DrawWallRevSubClamp4PalCommand *this,DrawerThread *thread)

{
  int iVar1;
  int iVar2;
  uint32_t *puVar3;
  uint32_t *puVar4;
  int i;
  int iVar5;
  long lVar6;
  int pass_skip;
  uint uVar7;
  uint uVar8;
  uint8_t *puVar9;
  ulong uVar10;
  int iVar11;
  uint uVar12;
  ulong uVar13;
  uint32_t local_48 [4];
  uint32_t local_38 [4];
  uint32_t dc_wall_iscale [4];
  uint32_t dc_wall_texturefrac [4];
  
  puVar9 = (this->super_PalWall4Command)._dest;
  iVar1 = (this->super_PalWall4Command)._count;
  iVar2 = (this->super_PalWall4Command)._fracbits;
  puVar3 = (this->super_PalWall4Command)._srcblend;
  puVar4 = (this->super_PalWall4Command)._destblend;
  local_38[0] = (this->super_PalWall4Command)._texturefrac[0];
  local_38[1] = (this->super_PalWall4Command)._texturefrac[1];
  local_38[2] = (this->super_PalWall4Command)._texturefrac[2];
  local_38[3] = (this->super_PalWall4Command)._texturefrac[3];
  local_48[0] = (this->super_PalWall4Command)._iscale[0];
  local_48[1] = (this->super_PalWall4Command)._iscale[1];
  local_48[2] = (this->super_PalWall4Command)._iscale[2];
  local_48[3] = (this->super_PalWall4Command)._iscale[3];
  iVar5 = (this->super_PalWall4Command).super_DrawerCommand._dest_y;
  iVar11 = thread->pass_end_y - iVar5;
  if (iVar11 < 1) {
    iVar11 = 0;
  }
  if (iVar1 < iVar11) {
    iVar11 = iVar1;
  }
  iVar1 = thread->num_cores;
  uVar7 = thread->pass_start_y - iVar5;
  if ((int)uVar7 < 1) {
    uVar7 = 0;
  }
  iVar5 = (iVar1 - (int)((iVar5 + uVar7) - thread->core) % iVar1) % iVar1;
  uVar10 = (long)(int)((~uVar7 + iVar1 + iVar11) - iVar5) / (long)iVar1;
  if (0 < (int)uVar10) {
    uVar10 = uVar10 & 0xffffffff;
    iVar11 = (this->super_PalWall4Command)._pitch;
    iVar5 = iVar5 + uVar7;
    lVar6 = 0;
    do {
      local_38[lVar6] = local_38[lVar6] + local_48[lVar6] * iVar5;
      local_48[lVar6] = local_48[lVar6] * iVar1;
      lVar6 = lVar6 + 1;
    } while (lVar6 != 4);
    puVar9 = puVar9 + (long)iVar5 * (long)iVar11;
    do {
      lVar6 = 0;
      do {
        uVar7 = local_38[lVar6];
        uVar13 = (ulong)(this->super_PalWall4Command)._source[lVar6][uVar7 >> ((byte)iVar2 & 0x3f)];
        if (uVar13 != 0) {
          uVar8 = (puVar4[puVar9[lVar6]] | 0x40100400) -
                  puVar3[(this->super_PalWall4Command)._colormap[lVar6][uVar13]];
          uVar12 = uVar8 & 0x40100400;
          uVar8 = uVar12 - (uVar12 >> 5) & uVar8 | 0x1f07c1f;
          puVar9[lVar6] = RGB32k.All[uVar8 >> 0xf & uVar8];
        }
        local_38[lVar6] = uVar7 + local_48[lVar6];
        lVar6 = lVar6 + 1;
      } while (lVar6 != 4);
      puVar9 = puVar9 + (this->super_PalWall4Command)._pitch;
      uVar7 = (int)uVar10 - 1;
      uVar10 = (ulong)uVar7;
    } while (uVar7 != 0);
  }
  return;
}

Assistant:

void DrawWallRevSubClamp4PalCommand::Execute(DrawerThread *thread)
	{
		uint8_t *dest = _dest;
		int count = _count;
		int bits = _fracbits;

		uint32_t *fg2rgb = _srcblend;
		uint32_t *bg2rgb = _destblend;

		uint32_t dc_wall_texturefrac[4] = { _texturefrac[0], _texturefrac[1], _texturefrac[2], _texturefrac[3] };
		uint32_t dc_wall_iscale[4] = { _iscale[0], _iscale[1], _iscale[2], _iscale[3] };

		count = thread->count_for_thread(_dest_y, count);
		if (count <= 0)
			return;

		int pitch = _pitch;
		int skipped = thread->skipped_by_thread(_dest_y);
		dest = thread->dest_for_thread(_dest_y, pitch, dest);
		for (int i = 0; i < 4; i++)
		{
			dc_wall_texturefrac[i] += dc_wall_iscale[i] * skipped;
			dc_wall_iscale[i] *= thread->num_cores;
		}
		pitch *= thread->num_cores;

		do
		{
			for (int i = 0; i < 4; ++i)
			{
				uint8_t pix = _source[i][dc_wall_texturefrac[i] >> bits];
				if (pix != 0)
				{
					uint32_t a = (bg2rgb[dest[i]] | 0x40100400) - fg2rgb[_colormap[i][pix]];
					uint32_t b = a;

					b &= 0x40100400;
					b = b - (b >> 5);
					a &= b;
					a |= 0x01f07c1f;
					dest[i] = RGB32k.All[a & (a >> 15)];
				}
				dc_wall_texturefrac[i] += dc_wall_iscale[i];
			}
			dest += _pitch;
		} while (--count);
	}